

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# freelist.hpp
# Opt level: O3

void __thiscall
boost::lockfree::detail::
fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
::initialize(fixed_size_freelist<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_boost::lockfree::detail::runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>_>
             *this)

{
  tagged_index tVar1;
  node *pnVar2;
  size_t sVar3;
  size_t sVar4;
  uint uVar5;
  
  sVar4 = (this->
          super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
          ).node_count_;
  if (sVar4 != 0) {
    pnVar2 = (this->
             super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
             ).nodes_;
    sVar3 = 0;
    do {
      (pnVar2->next)._M_i.index = (index_t)sVar4;
      uVar5 = (uint)sVar3 & 0xffff;
      tVar1 = (this->pool_)._M_i;
      *(index_t *)
       ((long)&(((this->
                 super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
                 ).nodes_)->next)._M_i.index + (ulong)(uVar5 << 6)) = tVar1.index;
      LOCK();
      (this->pool_)._M_i = (tagged_index)((uint)tVar1 & 0xffff0000 | uVar5);
      UNLOCK();
      sVar3 = sVar3 + 1;
      sVar4 = (this->
              super_runtime_sized_freelist_storage<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node,_std::allocator<boost::lockfree::queue<depspawn::internal::TaskPool::Task_*,_boost::lockfree::fixed_sized<true>_>::node>_>
              ).node_count_;
      pnVar2 = pnVar2 + 1;
    } while (sVar3 != sVar4);
  }
  return;
}

Assistant:

std::size_t node_count(void) const
    {
        return node_count_;
    }